

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.h
# Opt level: O0

void __thiscall CivetAuthHandler::CivetAuthHandler(CivetAuthHandler *this)

{
  CivetAuthHandler *this_local;
  
  this->_vptr_CivetAuthHandler = (_func_int **)&PTR__CivetAuthHandler_0019cb10;
  return;
}

Assistant:

class CIVETWEB_CXX_API CivetAuthHandler
{
  public:
	/**
	 * Destructor
	 */
	virtual ~CivetAuthHandler()
	{
	}

	/**
	 * Callback method for authorization requests. It is up the this handler
	 * to generate 401 responses if authorization fails.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if authorization succeeded, false otherwise
	 */
	virtual bool authorize(CivetServer *server, struct mg_connection *conn) = 0;
}